

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O3

shared_ptr<Assimp::Blender::ElemBase> __thiscall
Assimp::Blender::DNA::ConvertBlobToStructure(DNA *this,Structure *structure,FileDatabase *db)

{
  const_iterator cVar1;
  code *pcVar2;
  _Base_ptr p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool *pbVar5;
  shared_ptr<Assimp::Blender::ElemBase> sVar6;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
                  *)structure,(key_type *)db);
  if (cVar1._M_node == (_Base_ptr)&(structure->name)._M_string_length) {
    *(undefined8 *)&(this->converters)._M_t._M_impl = 0;
    *(undefined8 *)&(this->converters)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    pcVar2 = *(code **)(cVar1._M_node + 2);
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)(&db->i64bit +
                                            (long)&(cVar1._M_node[2]._M_parent)->_M_color) + -1);
    }
    (*pcVar2)(this);
    p_Var3 = cVar1._M_node[2]._M_left;
    pbVar5 = (bool *)((long)&(cVar1._M_node[2]._M_right)->_M_color + (long)&db->i64bit);
    if (((ulong)p_Var3 & 1) != 0) {
      p_Var3 = *(_Base_ptr *)(*(long *)pbVar5 + -1 + (long)p_Var3);
    }
    local_38 = *(undefined8 *)&(this->converters)._M_t._M_impl;
    local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                &(this->converters)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
    (*(code *)p_Var3)(pbVar5,&local_38);
    _Var4._M_pi = extraout_RDX_00;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  sVar6.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar6.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Assimp::Blender::ElemBase>)
         sVar6.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr< ElemBase > DNA :: ConvertBlobToStructure(
    const Structure& structure,
    const FileDatabase& db
) const
{
    std::map<std::string, FactoryPair >::const_iterator it = converters.find(structure.name);
    if (it == converters.end()) {
        return std::shared_ptr< ElemBase >();
    }

    std::shared_ptr< ElemBase > ret = (structure.*((*it).second.first))();
    (structure.*((*it).second.second))(ret,db);

    return ret;
}